

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O0

void __thiscall FSharedStringArena::FreeAll(FSharedStringArena *this)

{
  void *pvVar1;
  Node *pNVar2;
  Node *local_30;
  Node *string;
  void *limit;
  Block *block;
  Block *next;
  FSharedStringArena *this_local;
  
  limit = (this->super_FMemArena).TopBlock;
  while (limit != (void *)0x0) {
    pvVar1 = *limit;
    pNVar2 = *(Node **)((long)limit + 0x10);
    FMemArena::Block::Reset((Block *)limit);
    for (local_30 = *(Node **)((long)limit + 0x10); local_30 < pNVar2; local_30 = local_30 + 1) {
      Node::~Node(local_30);
    }
    *(Block **)limit = (this->super_FMemArena).FreeBlocks;
    (this->super_FMemArena).FreeBlocks = (Block *)limit;
    limit = pvVar1;
  }
  memset(this->Buckets,0,0x800);
  (this->super_FMemArena).TopBlock = (Block *)0x0;
  return;
}

Assistant:

void FSharedStringArena::FreeAll()
{
	for (Block *next, *block = TopBlock; block != NULL; block = next)
	{
		next = block->NextBlock;
		void *limit = block->Avail;
		block->Reset();
		for (Node *string = (Node *)block->Avail; string < limit; ++string)
		{
			string->~Node();
		}
		block->NextBlock = FreeBlocks;
		FreeBlocks = block;
	}
	memset(Buckets, 0, sizeof(Buckets));
	TopBlock = NULL;
}